

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteringRegister.hpp
# Opt level: O0

void __thiscall
supermap::
FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>::
FilteringRegister(FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>
                  *this,function<std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_()>
                        *filterSupplier,
                 function<supermap::Key<128UL>_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&)>
                 *func)

{
  function<supermap::Key<128UL>_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&)>
  *in_RDX;
  function<std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_()> *in_RDI;
  function<supermap::Key<128UL>_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&)>
  *in_stack_ffffffffffffffb8;
  
  StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ::StorageItemRegister
            ((StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              *)in_RDX);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR_clone_00390740;
  std::function<std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_()>::operator()(in_RDI);
  std::
  function<supermap::Key<128UL>_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&)>::
  function(in_RDX,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

explicit FilteringRegister(
        std::function<std::shared_ptr<FilterBase>()> filterSupplier,
        std::function<FilterT(const RegisterT &)> func
    ) : filter_(filterSupplier()), func_(std::move(func)) {}